

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_reporter_console.hpp
# Opt level: O2

void __thiscall Catch::ConsoleReporter::printOpenHeader(ConsoleReporter *this,string *_name)

{
  ostream *poVar1;
  Colour local_19 [8];
  Colour colourGuard;
  
  if (getLineOfChars<(char)45>()::line == '\0') {
    uRam000000000018e5d0 = 0x2d2d2d2d2d2d2d;
    uRam000000000018e5d7 = 0x2d2d2d2d2d2d2d2d;
    _DAT_0018e5c0 = 0x2d2d2d2d2d2d2d2d;
    uRam000000000018e5c8 = 0x2d2d2d2d2d2d2d;
    DAT_0018e5cf = 0x2d;
    _DAT_0018e5b0 = 0x2d2d2d2d2d2d2d2d;
    uRam000000000018e5b8 = 0x2d2d2d2d2d2d2d2d;
    _DAT_0018e5a0 = 0x2d2d2d2d2d2d2d2d;
    uRam000000000018e5a8 = 0x2d2d2d2d2d2d2d2d;
    _line = 0x2d2d2d2d2d2d2d2d;
    uRam000000000018e598 = 0x2d2d2d2d2d2d2d2d;
    DAT_0018e5df = 0;
  }
  poVar1 = std::operator<<((this->super_StreamingReporterBase).stream,
                           &getLineOfChars<(char)45>()::line);
  std::operator<<(poVar1,"\n");
  local_19[0].m_moved = false;
  Colour::use(Headers);
  printHeaderString(this,_name,0);
  Colour::~Colour(local_19);
  return;
}

Assistant:

void printOpenHeader( std::string const& _name ) {
            stream  << getLineOfChars<'-'>() << "\n";
            {
                Colour colourGuard( Colour::Headers );
                printHeaderString( _name );
            }
        }